

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

void udp_pipe_schedule(udp_pipe *p)

{
  udp_ep *puVar1;
  bool bVar2;
  bool local_19;
  _Bool changed;
  udp_ep *ep;
  udp_pipe *p_local;
  
  puVar1 = p->ep;
  bVar2 = p->expire < puVar1->next_wake;
  if (bVar2) {
    puVar1->next_wake = p->expire;
  }
  local_19 = p->next_wake < puVar1->next_wake;
  if (local_19) {
    puVar1->next_wake = p->next_wake;
  }
  local_19 = local_19 || bVar2;
  if (local_19) {
    nni_aio_abort(&puVar1->timeaio,NNG_EINTR);
  }
  return;
}

Assistant:

static void
udp_pipe_schedule(udp_pipe *p)
{
	udp_ep *ep      = p->ep;
	bool    changed = false;
	if (p->expire < ep->next_wake) {
		ep->next_wake = p->expire;
		changed       = true;
	}
	if (p->next_wake < ep->next_wake) {
		ep->next_wake = p->next_wake;
		changed       = true;
	}
	if (changed) {
		nni_aio_abort(&ep->timeaio, NNG_EINTR);
	}
}